

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::AddSlotArrayCheck(Lowerer *this,PropertySym *propertySym,Instr *instr)

{
  OpCode OVar1;
  uint uVar2;
  Instr *this_00;
  Instr *this_01;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint sourceContextId;
  uint functionId;
  uint32 uVar6;
  uint uVar7;
  JITTimeFunctionBody *this_02;
  FunctionJITTimeInfo *this_03;
  undefined4 *puVar8;
  Opnd *this_04;
  RegOpnd *pRVar9;
  Instr *this_05;
  IntConstOpnd *pIVar10;
  
  if (propertySym->m_stackSym == this->m_func->m_localClosureSym) {
    this_02 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_02);
    this_03 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_03);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,ClosureRangeCheckPhase,sourceContextId,functionId);
    if (bVar4) goto LAB_005b6ad0;
    this_00 = (propertySym->m_stackSym->field_5).m_instrDef;
    bVar4 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
    if (this_00 == (Instr *)0x0) goto LAB_005b6ad0;
    uVar2 = propertySym->m_propertyId;
    OVar1 = this_00->m_opcode;
    if (OVar1 < NewScopeSlots) {
      if (OVar1 != LdSlot) {
        if (OVar1 == ArgIn_A) goto LAB_005b6ad0;
        if (OVar1 != LdSlotArr) goto LAB_005b69e5;
      }
      if (bVar4 && 2 < uVar2) {
        this_01 = this_00->m_next;
        this_04 = IR::Instr::UnlinkDst(this_00);
        pRVar9 = IR::Opnd::AsRegOpnd(this_04);
        this_05 = IR::Instr::New(SlotArrayCheck,&pRVar9->super_Opnd,this->m_func);
        pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
        IR::Instr::SetDst(this_00,&pRVar9->super_Opnd);
        IR::Instr::SetSrc1(this_05,&pRVar9->super_Opnd);
        pIVar10 = IR::IntConstOpnd::New((ulong)uVar2,TyUint32,this->m_func,false);
        IR::Instr::SetSrc2(this_05,&pIVar10->super_Opnd);
        IR::Instr::InsertBefore(this_01,this_05);
      }
      goto LAB_005b6ad0;
    }
    if (1 < OVar1 - 0x21c) {
      if (OVar1 == SlotArrayCheck) {
        pIVar10 = IR::Opnd::AsIntConstOpnd(this_00->m_src2);
        uVar7 = IR::IntConstOpnd::AsInt32(pIVar10);
        if (uVar7 < uVar2) {
          pIVar10 = IR::IntConstOpnd::New((ulong)uVar2,TyUint32,this->m_func,false);
          IR::Instr::ReplaceSrc2(this_00,&pIVar10->super_Opnd);
        }
        goto LAB_005b6ad0;
      }
      if (OVar1 != NewScopeSlotsWithoutPropIds) goto LAB_005b69e5;
    }
    pIVar10 = (IntConstOpnd *)this_00->m_src1;
    OVar5 = IR::Opnd::GetKind((Opnd *)pIVar10);
    if (OVar5 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    uVar6 = IR::IntConstOpnd::AsUint32(pIVar10);
    if (uVar6 <= uVar2) {
LAB_005b69e5:
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
LAB_005b6ad0:
  return instr->m_prev;
}

Assistant:

IR::Instr* Lowerer::AddSlotArrayCheck(PropertySym *propertySym, IR::Instr* instr)
{
    if (propertySym->m_stackSym != m_func->GetLocalClosureSym() || PHASE_OFF(Js::ClosureRangeCheckPhase, m_func))
    {
        return instr->m_prev;
    }

    IR::Instr *instrDef = propertySym->m_stackSym->m_instrDef;

    bool doDynamicCheck = this->m_func->IsLoopBody();
    bool insertSlotArrayCheck = false;
    uint32 slotId = (uint32)propertySym->m_propertyId;

    if (instrDef)
    {
        switch (instrDef->m_opcode)
        {
        case Js::OpCode::NewScopeSlots:
        case Js::OpCode::NewStackScopeSlots:
        case Js::OpCode::NewScopeSlotsWithoutPropIds:
        {
            IR::Opnd *allocOpnd = allocOpnd = instrDef->GetSrc1();
            uint32 allocCount = allocOpnd->AsIntConstOpnd()->AsUint32();

            if (slotId >= allocCount)
            {
                Js::Throw::FatalInternalError();
            }
            break;
        }
        case Js::OpCode::ArgIn_A:
            break;
        case Js::OpCode::LdSlot:
        case Js::OpCode::LdSlotArr:
        {
            if (doDynamicCheck && slotId > Js::ScopeSlots::FirstSlotIndex)
            {
                insertSlotArrayCheck = true;
            }
            break;
        }
        case Js::OpCode::SlotArrayCheck:
        {
            uint32 currentSlotId = instrDef->GetSrc2()->AsIntConstOpnd()->AsInt32();
            if (slotId > currentSlotId)
            {
                instrDef->ReplaceSrc2(IR::IntConstOpnd::New(slotId, TyUint32, m_func));
            }
            break;
        }
        default:
            Js::Throw::FatalInternalError();
        }
    }
    if (insertSlotArrayCheck)
    {
        IR::Instr *insertInstr = instrDef->m_next;
        IR::RegOpnd *dstOpnd = instrDef->UnlinkDst()->AsRegOpnd();
        IR::Instr *checkInstr = IR::Instr::New(Js::OpCode::SlotArrayCheck, dstOpnd, m_func);

        dstOpnd = IR::RegOpnd::New(TyVar, m_func);
        instrDef->SetDst(dstOpnd);
        checkInstr->SetSrc1(dstOpnd);

        // Attach the slot ID to the check instruction.
        IR::IntConstOpnd *slotIdOpnd = IR::IntConstOpnd::New(slotId, TyUint32, m_func);
        checkInstr->SetSrc2(slotIdOpnd);
        insertInstr->InsertBefore(checkInstr);
    }
    return instr->m_prev;
}